

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparsehashtable.h
# Opt level: O3

void __thiscall
google::
sparse_hashtable_iterator<std::pair<const_A,_int>,_A,_HashA,_google::sparse_hash_map<A,_int,_HashA,_std::equal_to<A>,_google::libc_allocator_with_realloc<std::pair<const_A,_int>_>_>::SelectKey,_google::sparse_hash_map<A,_int,_HashA,_std::equal_to<A>,_google::libc_allocator_with_realloc<std::pair<const_A,_int>_>_>::SetKey,_std::equal_to<A>,_google::libc_allocator_with_realloc<std::pair<const_A,_int>_>_>
::advance_past_deleted
          (sparse_hashtable_iterator<std::pair<const_A,_int>,_A,_HashA,_google::sparse_hash_map<A,_int,_HashA,_std::equal_to<A>,_google::libc_allocator_with_realloc<std::pair<const_A,_int>_>_>::SelectKey,_google::sparse_hash_map<A,_int,_HashA,_std::equal_to<A>,_google::libc_allocator_with_realloc<std::pair<const_A,_int>_>_>::SetKey,_std::equal_to<A>,_google::libc_allocator_with_realloc<std::pair<const_A,_int>_>_>
           *this)

{
  sparse_hashtable<std::pair<const_A,_int>,_A,_HashA,_google::sparse_hash_map<A,_int,_HashA,_std::equal_to<A>,_google::libc_allocator_with_realloc<std::pair<const_A,_int>_>_>::SelectKey,_google::sparse_hash_map<A,_int,_HashA,_std::equal_to<A>,_google::libc_allocator_with_realloc<std::pair<const_A,_int>_>_>::SetKey,_std::equal_to<A>,_google::libc_allocator_with_realloc<std::pair<const_A,_int>_>_>
  *psVar1;
  sparsegroup<std::pair<const_A,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_A,_int>_>_>
  *psVar2;
  sparsegroup<std::pair<const_A,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_A,_int>_>_>
  *psVar3;
  pointer ppVar4;
  size_type sVar5;
  bool bVar6;
  bool bVar7;
  sparsegroup<std::pair<const_A,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_A,_int>_>_>
  *psVar8;
  sparsegroup<std::pair<const_A,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_A,_int>_>_>
  *psVar9;
  pointer ppVar10;
  
  psVar1 = this->ht;
  psVar2 = (this->pos).row_end._M_current;
  psVar3 = (this->end).row_current._M_current;
  ppVar4 = (this->end).col_current;
  psVar9 = (this->pos).row_current._M_current;
  ppVar10 = (this->pos).col_current;
  bVar6 = (this->end).row_end._M_current != psVar2;
  bVar7 = (this->pos).row_begin._M_current != (this->end).row_begin._M_current;
  if (((bVar6 || bVar7) || (psVar9 != psVar3)) || (psVar3 != psVar2 && ppVar10 != ppVar4)) {
    sVar5 = psVar1->num_deleted;
    do {
      if (sVar5 == 0) {
        return;
      }
      if ((psVar1->key_info).delkey._i != (ppVar10->first)._i) {
        return;
      }
      ppVar10 = ppVar10 + 1;
      (this->pos).col_current = ppVar10;
      if (ppVar10 == psVar9->group + (psVar9->settings).num_buckets) {
        psVar9 = psVar9 + 1;
        if (psVar9 != psVar2) {
          do {
            psVar8 = psVar9;
            psVar9 = psVar8;
            if ((psVar8->settings).num_buckets != 0) break;
            psVar9 = psVar8 + 1;
          } while (psVar9 != psVar2);
          ppVar10 = psVar8->group;
          (this->pos).col_current = ppVar10;
        }
        (this->pos).row_current._M_current = psVar9;
      }
    } while ((psVar9 != psVar3 || (bVar6 || bVar7)) || (psVar3 != psVar2 && ppVar10 != ppVar4));
  }
  return;
}

Assistant:

void advance_past_deleted() {
    while (pos != end && ht->test_deleted(*this)) ++pos;
  }